

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddRectFilled
          (ImDrawList *this,ImVec2 *p_min,ImVec2 *p_max,ImU32 col,float rounding,ImDrawFlags flags)

{
  uint in_ECX;
  undefined8 in_RDX;
  ImU32 col_00;
  ImVec2 *in_RSI;
  ImDrawList *in_RDI;
  uint in_R8D;
  float in_XMM0_Da;
  ImDrawList *unaff_retaddr;
  ImDrawFlags in_stack_00000048;
  float in_stack_0000004c;
  ImVec2 *in_stack_00000050;
  ImVec2 *in_stack_00000058;
  ImDrawList *in_stack_00000060;
  ImU32 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd8;
  
  col_00 = (ImU32)((ulong)in_RDX >> 0x20);
  if ((in_ECX & 0xff000000) != 0) {
    if ((in_XMM0_Da < 0.5) || ((in_R8D & 0x1f0) == 0x100)) {
      PrimReserve((ImDrawList *)CONCAT44(in_ECX,in_XMM0_Da),in_R8D,in_stack_ffffffffffffffd8);
      PrimRect(unaff_retaddr,(ImVec2 *)in_RDI,in_RSI,col_00);
    }
    else {
      PathRect(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_0000004c,
               in_stack_00000048);
      PathFillConvex(in_RDI,in_stack_ffffffffffffffcc);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilled(const ImVec2& p_min, const ImVec2& p_max, ImU32 col, float rounding, ImDrawFlags flags)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;
    if (rounding < 0.5f || (flags & ImDrawFlags_RoundCornersMask_) == ImDrawFlags_RoundCornersNone)
    {
        PrimReserve(6, 4);
        PrimRect(p_min, p_max, col);
    }
    else
    {
        PathRect(p_min, p_max, rounding, flags);
        PathFillConvex(col);
    }
}